

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::set_current_tabpage(Nvim *this,Tabpage tabpage)

{
  string local_70;
  Tabpage local_50;
  variant<_cf2d41c5_> local_48;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50 = tabpage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nvim_set_current_tabpage","")
  ;
  NvimRPC::do_call<long>((Object *)&local_48,&this->client_,&local_70,&local_50);
  boost::variant<$cf2d41c5$>::destroy_content(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::set_current_tabpage(Tabpage tabpage) {
    client_.call("nvim_set_current_tabpage", nullptr, tabpage);
}